

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomposer.cpp
# Opt level: O1

void test_interval(int gid,DiscreteBounds *param_2,DiscreteBounds *bounds,DiscreteBounds *param_4,
                  RegularGridLink *param_5)

{
  int local_ac;
  AssertionHandler local_a8;
  undefined **local_60;
  undefined1 local_58;
  undefined1 local_57;
  int *local_50;
  char *local_48;
  undefined8 local_40;
  int *local_38;
  
  local_a8.m_assertionInfo.macroName.m_start = "REQUIRE";
  local_a8.m_assertionInfo.macroName.m_size = 7;
  local_a8.m_assertionInfo.lineInfo.file =
       "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/decomposer.cpp";
  local_a8.m_assertionInfo.lineInfo.line = 0x1b;
  local_a8.m_assertionInfo.capturedExpression.m_start = "bounds.min[0] == gid";
  local_a8.m_assertionInfo.capturedExpression.m_size = 0x14;
  local_a8.m_assertionInfo.resultDisposition = Normal;
  local_a8.m_reaction.shouldDebugBreak = false;
  local_a8.m_reaction.shouldThrow = false;
  local_a8.m_completed = false;
  local_ac = gid;
  local_a8.m_resultCapture = Catch::getResultCapture();
  local_50 = (bounds->min).super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  local_57 = *local_50 == local_ac;
  local_58 = 1;
  local_60 = &PTR_streamReconstructedExpression_0019e908;
  local_48 = "==";
  local_40 = 2;
  local_38 = &local_ac;
  (*(local_a8.m_resultCapture)->_vptr_IResultCapture[10])
            (local_a8.m_resultCapture,&local_a8,&local_60,&local_a8.m_reaction);
  Catch::AssertionHandler::complete(&local_a8);
  if (local_a8.m_completed == false) {
    (*(local_a8.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_a8.m_assertionInfo.macroName.m_start = "REQUIRE";
  local_a8.m_assertionInfo.macroName.m_size = 7;
  local_a8.m_assertionInfo.lineInfo.file =
       "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/decomposer.cpp";
  local_a8.m_assertionInfo.lineInfo.line = 0x1c;
  local_a8.m_assertionInfo.capturedExpression.m_start = "bounds.max[0] == gid";
  local_a8.m_assertionInfo.capturedExpression.m_size = 0x14;
  local_a8.m_assertionInfo.resultDisposition = Normal;
  local_a8.m_reaction.shouldDebugBreak = false;
  local_a8.m_reaction.shouldThrow = false;
  local_a8.m_completed = false;
  local_a8.m_resultCapture = Catch::getResultCapture();
  local_50 = (bounds->max).super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  local_57 = *local_50 == local_ac;
  local_58 = 1;
  local_60 = &PTR_streamReconstructedExpression_0019e908;
  local_48 = "==";
  local_40 = 2;
  local_38 = &local_ac;
  (*(local_a8.m_resultCapture)->_vptr_IResultCapture[10])
            (local_a8.m_resultCapture,&local_a8,&local_60,&local_a8.m_reaction);
  Catch::AssertionHandler::complete(&local_a8);
  if (local_a8.m_completed == false) {
    (*(local_a8.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_a8.m_assertionInfo.macroName.m_start = "REQUIRE";
  local_a8.m_assertionInfo.macroName.m_size = 7;
  local_a8.m_assertionInfo.lineInfo.file =
       "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/decomposer.cpp";
  local_a8.m_assertionInfo.lineInfo.line = 0x1d;
  local_a8.m_assertionInfo.capturedExpression.m_start = "bounds.min[0] == gid";
  local_a8.m_assertionInfo.capturedExpression.m_size = 0x14;
  local_a8.m_assertionInfo.resultDisposition = Normal;
  local_a8.m_reaction.shouldDebugBreak = false;
  local_a8.m_reaction.shouldThrow = false;
  local_a8.m_completed = false;
  local_a8.m_resultCapture = Catch::getResultCapture();
  local_50 = (bounds->min).super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  local_57 = *local_50 == local_ac;
  local_58 = 1;
  local_60 = &PTR_streamReconstructedExpression_0019e908;
  local_48 = "==";
  local_40 = 2;
  local_38 = &local_ac;
  (*(local_a8.m_resultCapture)->_vptr_IResultCapture[10])
            (local_a8.m_resultCapture,&local_a8,&local_60,&local_a8.m_reaction);
  Catch::AssertionHandler::complete(&local_a8);
  if (local_a8.m_completed == false) {
    (*(local_a8.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_a8.m_assertionInfo.macroName.m_start = "REQUIRE";
  local_a8.m_assertionInfo.macroName.m_size = 7;
  local_a8.m_assertionInfo.lineInfo.file =
       "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/decomposer.cpp";
  local_a8.m_assertionInfo.lineInfo.line = 0x1e;
  local_a8.m_assertionInfo.capturedExpression.m_start = "bounds.max[0] == gid";
  local_a8.m_assertionInfo.capturedExpression.m_size = 0x14;
  local_a8.m_assertionInfo.resultDisposition = Normal;
  local_a8.m_reaction.shouldDebugBreak = false;
  local_a8.m_reaction.shouldThrow = false;
  local_a8.m_completed = false;
  local_a8.m_resultCapture = Catch::getResultCapture();
  local_50 = (bounds->max).super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  local_57 = *local_50 == local_ac;
  local_58 = 1;
  local_60 = &PTR_streamReconstructedExpression_0019e908;
  local_48 = "==";
  local_40 = 2;
  local_38 = &local_ac;
  (*(local_a8.m_resultCapture)->_vptr_IResultCapture[10])
            (local_a8.m_resultCapture,&local_a8,&local_60,&local_a8.m_reaction);
  Catch::AssertionHandler::complete(&local_a8);
  if (local_a8.m_completed == false) {
    (*(local_a8.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  return;
}

Assistant:

void  test_interval(int gid,
                    const diy::DiscreteBounds&,
                    const diy::DiscreteBounds& bounds,
                    const diy::DiscreteBounds&,
                    const diy::RegularGridLink&)
{
    REQUIRE(bounds.min[0] == gid);
    REQUIRE(bounds.max[0] == gid);
    REQUIRE(bounds.min[0] == gid);
    REQUIRE(bounds.max[0] == gid);
}